

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

uint dos_time(time_t unix_time)

{
  tm *ptVar1;
  undefined1 local_58 [8];
  tm_conflict1 tmbuf;
  uint dt;
  tm_conflict1 *t;
  time_t unix_time_local;
  
  t = (tm_conflict1 *)unix_time;
  ptVar1 = localtime_r((time_t *)&t,(tm *)local_58);
  if (ptVar1->tm_year < 0x50) {
    tmbuf.tm_zone._4_4_ = 0x210000;
  }
  else if (ptVar1->tm_year < 0xd0) {
    tmbuf.tm_zone._4_4_ =
         ((int)(ptVar1->tm_sec & 0x3eU) >> 1) +
         (ptVar1->tm_min & 0x3fU) * 0x20 +
         (ptVar1->tm_hour & 0x1fU) * 0x800 +
         ((ptVar1->tm_mday & 0x1fU) +
         (ptVar1->tm_mon + 1U & 0xf) * 0x20 + (ptVar1->tm_year - 0x50U & 0x7f) * 0x200) * 0x10000;
  }
  else {
    tmbuf.tm_zone._4_4_ = 0xff9fbf7d;
  }
  return tmbuf.tm_zone._4_4_;
}

Assistant:

static unsigned int
dos_time(const time_t unix_time)
{
	struct tm *t;
	unsigned int dt;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif

#if defined(HAVE_LOCALTIME_S)
	t = localtime_s(&tmbuf, &unix_time) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	t = localtime_r(&unix_time, &tmbuf);
#else
	t = localtime(&unix_time);
#endif

	/* MSDOS-style date/time is only between 1980-01-01 and 2107-12-31 */
	if (t->tm_year < 1980 - 1900)
		/* Set minimum date/time '1980-01-01 00:00:00'. */
		dt = 0x00210000U;
	else if (t->tm_year > 2107 - 1900)
		/* Set maximum date/time '2107-12-31 23:59:58'. */
		dt = 0xff9fbf7dU;
	else {
		dt = 0;
		dt += ((t->tm_year - 80) & 0x7f) << 9;
		dt += ((t->tm_mon + 1) & 0x0f) << 5;
		dt += (t->tm_mday & 0x1f);
		dt <<= 16;
		dt += (t->tm_hour & 0x1f) << 11;
		dt += (t->tm_min & 0x3f) << 5;
		dt += (t->tm_sec & 0x3e) >> 1; /* Only counting every 2 seconds. */
	}
	return dt;
}